

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O3

Vec_Ptr_t * Abc_NtkPartitionSmart(Abc_Ntk_t *pNtk,int nSuppSizeLimit,int fVerbose)

{
  ulong uVar1;
  Vec_Int_t *vOne;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  undefined8 *puVar7;
  void *pvVar8;
  Vec_Ptr_t *vPartSuppsAll;
  ProgressBar *p;
  Vec_Int_t *pVVar9;
  Vec_Int_t *pVVar10;
  int *piVar11;
  uint *puVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  Vec_Ptr_t *pVVar18;
  int iVar19;
  Abc_Ntk_t *pAVar20;
  size_t sVar21;
  timespec ts;
  uint local_c4;
  long local_c0;
  Vec_Ptr_t local_b8;
  undefined8 *local_a8;
  ulong local_a0;
  ulong local_98;
  int local_90;
  int local_8c;
  ulong local_88;
  ulong local_80;
  Vec_Ptr_t *local_78;
  ulong local_70;
  ProgressBar *local_68;
  Vec_Ptr_t *local_60;
  Abc_Ntk_t *local_58;
  ulong local_50;
  long local_48;
  Vec_Ptr_t *local_40;
  ulong local_38;
  
  local_8c = nSuppSizeLimit;
  local_58 = pNtk;
  iVar2 = clock_gettime(3,(timespec *)&local_b8);
  if (iVar2 < 0) {
    lVar13 = 1;
  }
  else {
    lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_b8.pArray),8);
    lVar13 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + local_b8._0_8_ * -1000000;
  }
  pAVar20 = local_58;
  local_78 = Abc_NtkComputeSupportsSmart(local_58);
  if (fVerbose != 0) {
    Abc_Print((int)pAVar20,"%s =","Supps");
    iVar19 = 3;
    iVar2 = clock_gettime(3,(timespec *)&local_b8);
    if (iVar2 < 0) {
      lVar14 = -1;
    }
    else {
      lVar14 = (long)local_b8.pArray / 1000 + local_b8._0_8_ * 1000000;
    }
    Abc_Print(iVar19,"%9.2f sec\n",(double)(lVar14 + lVar13) / 1000000.0);
  }
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 1000;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(8000);
  pVVar5->pArray = ppvVar6;
  iVar2 = clock_gettime(3,(timespec *)&local_b8);
  if (iVar2 < 0) {
    local_48 = 1;
  }
  else {
    lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_b8.pArray),8);
    local_48 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + local_b8._0_8_ * -1000000;
  }
  local_90 = fVerbose;
  puVar7 = (undefined8 *)malloc(0x10);
  *puVar7 = 0x100;
  pvVar8 = malloc(0x800);
  puVar7[1] = pvVar8;
  local_a8 = puVar7;
  vPartSuppsAll = (Vec_Ptr_t *)malloc(0x10);
  vPartSuppsAll->nCap = 0x100;
  vPartSuppsAll->nSize = 0;
  ppvVar6 = (void **)malloc(0x800);
  vPartSuppsAll->pArray = ppvVar6;
  uVar15 = (ulong)local_78->nSize;
  p = Extra_ProgressBarStart(_stdout,local_78->nSize);
  local_50 = uVar15;
  if ((long)uVar15 < 1) {
    Extra_ProgressBarStop(p);
    ppvVar6 = pVVar5->pArray;
    uVar15 = 0;
    local_c4 = 0;
LAB_002eb73d:
    if (ppvVar6 != (void **)0x0) goto LAB_002eb742;
  }
  else {
    local_98 = 0;
    local_70 = 0x100;
    local_80 = 1000;
    local_88 = 0x100;
    uVar4 = 0;
    local_a0 = 0;
    uVar16 = 0;
    local_68 = p;
    local_60 = pVVar5;
    local_40 = vPartSuppsAll;
    do {
      vOne = (Vec_Int_t *)local_78->pArray[uVar16];
      if ((p == (ProgressBar *)0x0) || ((long)p->nItemsNext <= (long)uVar16)) {
        Extra_ProgressBarUpdate_int(p,(int)uVar16,(char *)0x0);
      }
      local_38 = uVar16;
      if (vOne->nSize < 1) goto LAB_002ebb00;
      uVar3 = vOne->nSize - 1;
      vOne->nSize = uVar3;
      iVar2 = vOne->pArray[uVar3];
      pVVar18 = &local_b8;
      clock_gettime(3,(timespec *)&local_b8);
      uVar3 = Abc_NtkPartitionSmartFindPart(vPartSuppsAll,pVVar18,pVVar5,local_8c,vOne);
      clock_gettime(3,(timespec *)&local_b8);
      if (uVar3 == 0xffffffff) {
        pVVar10 = (Vec_Int_t *)malloc(0x10);
        pVVar10->nCap = 0x20;
        pVVar10->nSize = 0;
        piVar11 = (int *)malloc(0x80);
        pVVar10->pArray = piVar11;
        Vec_IntPush(pVVar10,iVar2);
        piVar11 = (int *)malloc(0x10);
        uVar15 = local_70;
        iVar2 = vOne->nSize;
        piVar11[1] = iVar2;
        *piVar11 = iVar2;
        if ((long)iVar2 == 0) {
          sVar21 = 0;
          pvVar8 = (void *)0x0;
        }
        else {
          sVar21 = (long)iVar2 << 2;
          pvVar8 = malloc(sVar21);
        }
        *(void **)(piVar11 + 2) = pvVar8;
        memcpy(pvVar8,vOne->pArray,sVar21);
        pVVar5 = local_60;
        iVar2 = (int)local_88;
        if ((int)local_a0 == iVar2) {
          if (iVar2 < 0x10) {
            if ((void *)local_a8[1] == (void *)0x0) {
              pvVar8 = malloc(0x80);
            }
            else {
              pvVar8 = realloc((void *)local_a8[1],0x80);
            }
            local_a8[1] = pvVar8;
            *(undefined4 *)local_a8 = 0x10;
            local_88 = 0x10;
          }
          else {
            local_88 = (ulong)(uint)(iVar2 * 2);
            if ((void *)local_a8[1] == (void *)0x0) {
              pvVar8 = malloc(local_88 * 8);
            }
            else {
              pvVar8 = realloc((void *)local_a8[1],local_88 * 8);
            }
            local_a8[1] = pvVar8;
            *(int *)local_a8 = (int)local_88;
          }
        }
        else {
          pvVar8 = (void *)local_a8[1];
        }
        local_c4 = (int)local_a0 + 1;
        *(uint *)((long)local_a8 + 4) = local_c4;
        *(Vec_Int_t **)((long)pvVar8 + (long)(int)local_a0 * 8) = pVVar10;
        uVar3 = (uint)uVar15;
        if (uVar4 == uVar3) {
          if ((int)uVar3 < 0x10) {
            if (vPartSuppsAll->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(0x80);
            }
            else {
              ppvVar6 = (void **)realloc(vPartSuppsAll->pArray,0x80);
            }
            vPartSuppsAll->pArray = ppvVar6;
            vPartSuppsAll->nCap = 0x10;
            local_70 = 0x10;
          }
          else {
            uVar3 = uVar3 * 2;
            sVar21 = (ulong)uVar3 * 8;
            if (vPartSuppsAll->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(sVar21);
            }
            else {
              ppvVar6 = (void **)realloc(vPartSuppsAll->pArray,sVar21);
            }
            vPartSuppsAll->pArray = ppvVar6;
            vPartSuppsAll->nCap = uVar3;
            local_70 = (ulong)uVar3;
          }
        }
        else {
          ppvVar6 = vPartSuppsAll->pArray;
        }
        vPartSuppsAll->nSize = uVar4 + 1;
        ppvVar6[(int)uVar4] = piVar11;
        puVar12 = Abc_NtkSuppCharStart(vOne,local_58->vCis->nSize);
        p = local_68;
        iVar2 = (int)local_80;
        if ((int)local_98 == iVar2) {
          if (iVar2 < 0x10) {
            if (pVVar5->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(0x80);
            }
            else {
              ppvVar6 = (void **)realloc(pVVar5->pArray,0x80);
            }
            pVVar5->pArray = ppvVar6;
            pVVar5->nCap = 0x10;
            local_80 = 0x10;
          }
          else {
            local_80 = (ulong)(uint)(iVar2 * 2);
            if (pVVar5->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(local_80 * 8);
            }
            else {
              ppvVar6 = (void **)realloc(pVVar5->pArray,local_80 * 8);
            }
            pVVar5->pArray = ppvVar6;
            pVVar5->nCap = (int)local_80;
          }
        }
        else {
          ppvVar6 = pVVar5->pArray;
        }
        local_a0 = (ulong)local_c4;
        pVVar5->nSize = (int)local_98 + 1U;
        ppvVar6[(int)local_98] = puVar12;
        local_98 = (ulong)((int)local_98 + 1U);
        uVar4 = uVar4 + 1;
      }
      else {
        if (((int)uVar3 < 0) || ((int)local_a0 <= (int)uVar3)) goto LAB_002ebae1;
        uVar15 = (ulong)uVar3;
        Vec_IntPush(*(Vec_Int_t **)(local_a8[1] + uVar15 * 8),iVar2);
        if ((int)uVar4 <= (int)uVar3) goto LAB_002ebae1;
        ppvVar6 = vPartSuppsAll->pArray;
        pVVar10 = (Vec_Int_t *)ppvVar6[uVar15];
        pVVar9 = Vec_IntTwoMerge(pVVar10,vOne);
        if (pVVar10->pArray != (int *)0x0) {
          free(pVVar10->pArray);
        }
        free(pVVar10);
        pVVar5 = local_60;
        ppvVar6[uVar15] = pVVar9;
        if ((int)local_98 <= (int)uVar3) goto LAB_002ebae1;
        Abc_NtkSuppCharAdd((uint *)local_60->pArray[uVar15],vOne,local_58->vCis->nSize);
        local_c4 = (uint)local_a0;
        vPartSuppsAll = local_40;
        p = local_68;
      }
      uVar15 = (ulong)uVar4;
      uVar16 = local_38 + 1;
    } while (uVar16 < local_50);
    Extra_ProgressBarStop(p);
    ppvVar6 = pVVar5->pArray;
    if ((int)local_98 < 1) goto LAB_002eb73d;
    uVar17 = local_98 & 0xffffffff;
    uVar16 = 0;
    do {
      if (ppvVar6[uVar16] != (void *)0x0) {
        free(ppvVar6[uVar16]);
      }
      uVar16 = uVar16 + 1;
    } while (uVar17 != uVar16);
LAB_002eb742:
    free(ppvVar6);
  }
  free(pVVar5);
  if (local_90 != 0) {
    Abc_Print((int)pVVar5,"%s =","Parts");
    iVar19 = 3;
    iVar2 = clock_gettime(3,(timespec *)&local_b8);
    if (iVar2 < 0) {
      lVar13 = -1;
    }
    else {
      lVar13 = (long)local_b8.pArray / 1000 + local_b8._0_8_ * 1000000;
    }
    Abc_Print(iVar19,"%9.2f sec\n",(double)(lVar13 + local_48) / 1000000.0);
  }
  iVar2 = clock_gettime(3,(timespec *)&local_b8);
  if (iVar2 < 0) {
    local_c0 = 1;
  }
  else {
    lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_b8.pArray),8);
    local_c0 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + local_b8._0_8_ * -1000000;
  }
  ppvVar6 = vPartSuppsAll->pArray;
  local_a0 = CONCAT44(local_a0._4_4_,(int)uVar15);
  if (0 < (int)uVar15) {
    uVar16 = 0;
    do {
      Vec_IntPush((Vec_Int_t *)ppvVar6[uVar16],(int)uVar16);
      uVar16 = uVar16 + 1;
    } while (uVar15 != uVar16);
  }
  iVar2 = (int)local_a0;
  qsort(ppvVar6,(long)(int)local_a0,8,Vec_VecSortCompare2);
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 0x100;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(0x800);
  pVVar5->pArray = ppvVar6;
  if (0 < iVar2) {
    uVar17 = 0x100;
    uVar16 = 0;
    do {
      pvVar8 = vPartSuppsAll->pArray[uVar16];
      if (*(int *)((long)pvVar8 + 4) < 1) {
LAB_002ebb00:
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
      }
      uVar4 = *(int *)((long)pvVar8 + 4) - 1;
      *(uint *)((long)pvVar8 + 4) = uVar4;
      iVar2 = *(int *)(*(long *)((long)pvVar8 + 8) + (ulong)uVar4 * 4);
      if (((long)iVar2 < 0) || ((int)local_c4 <= iVar2)) {
LAB_002ebae1:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar8 = *(void **)(local_a8[1] + (long)iVar2 * 8);
      iVar2 = (int)uVar17;
      if ((int)uVar16 == iVar2) {
        if (iVar2 < 0x10) {
          if (pVVar5->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar5->pArray,0x80);
          }
          pVVar5->pArray = ppvVar6;
          pVVar5->nCap = 0x10;
          uVar17 = 0x10;
        }
        else {
          uVar17 = (ulong)(uint)(iVar2 * 2);
          if (pVVar5->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(uVar17 * 8);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar5->pArray,uVar17 * 8);
          }
          pVVar5->pArray = ppvVar6;
          pVVar5->nCap = iVar2 * 2;
        }
      }
      else {
        ppvVar6 = pVVar5->pArray;
      }
      uVar1 = uVar16 + 1;
      pVVar5->nSize = (int)uVar1;
      ppvVar6[uVar16] = pvVar8;
      uVar16 = uVar1;
    } while (uVar15 != uVar1);
  }
  if ((void *)local_a8[1] != (void *)0x0) {
    free((void *)local_a8[1]);
  }
  free(local_a8);
  pVVar18 = pVVar5;
  Abc_NtkPartitionCompact(pVVar5,vPartSuppsAll,local_8c);
  if (local_90 != 0) {
    Abc_Print((int)pVVar18,"%s =","Comps");
    iVar19 = 3;
    iVar2 = clock_gettime(3,(timespec *)&local_b8);
    if (iVar2 < 0) {
      lVar13 = -1;
    }
    else {
      lVar13 = (long)local_b8.pArray / 1000 + local_b8._0_8_ * 1000000;
    }
    Abc_Print(iVar19,"%9.2f sec\n",(double)(lVar13 + local_c0) / 1000000.0);
    printf("Created %d partitions.\n",(ulong)(uint)pVVar5->nSize);
  }
  ppvVar6 = local_78->pArray;
  if ((int)local_50 < 1) {
    if (ppvVar6 != (void **)0x0) goto LAB_002eba6e;
  }
  else {
    uVar16 = 0;
    do {
      pvVar8 = ppvVar6[uVar16];
      if (pvVar8 != (void *)0x0) {
        if (*(void **)((long)pvVar8 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar8 + 8));
        }
        free(pvVar8);
      }
      uVar16 = uVar16 + 1;
    } while (local_50 != uVar16);
LAB_002eba6e:
    free(ppvVar6);
  }
  free(local_78);
  ppvVar6 = vPartSuppsAll->pArray;
  if ((int)local_a0 < 1) {
    if (ppvVar6 == (void **)0x0) goto LAB_002ebac4;
  }
  else {
    uVar16 = 0;
    do {
      pvVar8 = ppvVar6[uVar16];
      if (pvVar8 != (void *)0x0) {
        if (*(void **)((long)pvVar8 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar8 + 8));
        }
        free(pvVar8);
      }
      uVar16 = uVar16 + 1;
    } while (uVar15 != uVar16);
  }
  free(ppvVar6);
LAB_002ebac4:
  free(vPartSuppsAll);
  return pVVar5;
}

Assistant:

Vec_Ptr_t * Abc_NtkPartitionSmart( Abc_Ntk_t * pNtk, int nSuppSizeLimit, int fVerbose )
{
    ProgressBar * pProgress;
    Vec_Ptr_t * vPartSuppsChar;
    Vec_Ptr_t * vSupps, * vPartsAll, * vPartsAll2, * vPartSuppsAll;
    Vec_Int_t * vOne, * vPart, * vPartSupp, * vTemp;
    int i, iPart, iOut, timeFind = 0;
    abctime clk, clk2;

    // compute the supports for all outputs
clk = Abc_Clock();
//    vSupps = Abc_NtkComputeSupportsNaive( pNtk );
    vSupps = Abc_NtkComputeSupportsSmart( pNtk );
if ( fVerbose )
{
ABC_PRT( "Supps", Abc_Clock() - clk );
}
    // start char-based support representation
    vPartSuppsChar = Vec_PtrAlloc( 1000 );

    // create partitions
clk = Abc_Clock();
    vPartsAll = Vec_PtrAlloc( 256 );
    vPartSuppsAll = Vec_PtrAlloc( 256 );
    pProgress = Extra_ProgressBarStart( stdout, Vec_PtrSize(vSupps) );
    Vec_PtrForEachEntry( Vec_Int_t *, vSupps, vOne, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
//        if ( i % 1000 == 0 )
//            printf( "CIs = %6d. COs = %6d. Processed = %6d (out of %6d). Parts = %6d.\r", 
//                Abc_NtkCiNum(pNtk), Abc_NtkCoNum(pNtk), i, Vec_PtrSize(vSupps), Vec_PtrSize(vPartsAll) ); 
        // get the output number
        iOut = Vec_IntPop(vOne);
        // find closely matching part
clk2 = Abc_Clock();
        iPart = Abc_NtkPartitionSmartFindPart( vPartSuppsAll, vPartsAll, vPartSuppsChar, nSuppSizeLimit, vOne );
timeFind += Abc_Clock() - clk2;
        if ( iPart == -1 )
        {
            // create new partition
            vPart = Vec_IntAlloc( 32 );
            Vec_IntPush( vPart, iOut );
            // create new partition support
            vPartSupp = Vec_IntDup( vOne );
            // add this partition and its support
            Vec_PtrPush( vPartsAll, vPart );
            Vec_PtrPush( vPartSuppsAll, vPartSupp );

            Vec_PtrPush( vPartSuppsChar, Abc_NtkSuppCharStart(vOne, Abc_NtkCiNum(pNtk)) );
        }
        else
        {
            // add output to this partition
            vPart = (Vec_Int_t *)Vec_PtrEntry( vPartsAll, iPart );
            Vec_IntPush( vPart, iOut );
            // merge supports
            vPartSupp = (Vec_Int_t *)Vec_PtrEntry( vPartSuppsAll, iPart );
            vPartSupp = Vec_IntTwoMerge( vTemp = vPartSupp, vOne );
            Vec_IntFree( vTemp );
            // reinsert new support
            Vec_PtrWriteEntry( vPartSuppsAll, iPart, vPartSupp );

            Abc_NtkSuppCharAdd( (unsigned *)Vec_PtrEntry(vPartSuppsChar, iPart), vOne, Abc_NtkCiNum(pNtk) );
        }
    }
    Extra_ProgressBarStop( pProgress );

    // stop char-based support representation
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsChar, vTemp, i )
        ABC_FREE( vTemp );
    Vec_PtrFree( vPartSuppsChar );

//printf( "\n" );
if ( fVerbose )
{
ABC_PRT( "Parts", Abc_Clock() - clk );
//ABC_PRT( "Find ", timeFind );
}

clk = Abc_Clock();
    // remember number of supports
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsAll, vOne, i )
        Vec_IntPush( vOne, i );
    // sort the supports in the decreasing order
    Vec_VecSort( (Vec_Vec_t *)vPartSuppsAll, 1 );
    // reproduce partitions
    vPartsAll2 = Vec_PtrAlloc( 256 );
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsAll, vOne, i )
        Vec_PtrPush( vPartsAll2, Vec_PtrEntry(vPartsAll, Vec_IntPop(vOne)) );
    Vec_PtrFree( vPartsAll );
    vPartsAll = vPartsAll2;

    // compact small partitions
//    Abc_NtkPartitionPrint( pNtk, vPartsAll, vPartSuppsAll );
    Abc_NtkPartitionCompact( vPartsAll, vPartSuppsAll, nSuppSizeLimit );

if ( fVerbose )
{
ABC_PRT( "Comps", Abc_Clock() - clk );
}
    if ( fVerbose )
    printf( "Created %d partitions.\n", Vec_PtrSize(vPartsAll) );
//    Abc_NtkPartitionPrint( pNtk, vPartsAll, vPartSuppsAll );

    // cleanup
    Vec_VecFree( (Vec_Vec_t *)vSupps );
    Vec_VecFree( (Vec_Vec_t *)vPartSuppsAll );
/*
    // converts from intergers to nodes
    Vec_PtrForEachEntry( Vec_Int_t *, vPartsAll, vPart, iPart )
    {
        vPartPtr = Vec_PtrAlloc( Vec_IntSize(vPart) );
        Vec_IntForEachEntry( vPart, iOut, i )
            Vec_PtrPush( vPartPtr, Abc_NtkCo(pNtk, iOut) );
        Vec_IntFree( vPart );
        Vec_PtrWriteEntry( vPartsAll, iPart, vPartPtr );
    }
*/
    return vPartsAll;
}